

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O3

void show_quiver(wchar_t mode,item_tester tester)

{
  object **list;
  ulong uVar1;
  wchar_t last;
  ulong uVar2;
  
  wipe_obj_list();
  list = player->upkeep->quiver;
  uVar2 = 0xffffffff;
  last = L'\xffffffff';
  if ((ulong)z_info->quiver_size != 0) {
    uVar1 = 0;
    do {
      if (list[uVar1] != (object *)0x0) {
        uVar2 = uVar1 & 0xffffffff;
      }
      last = (wchar_t)uVar2;
      uVar1 = uVar1 + 1;
    } while (z_info->quiver_size != uVar1);
  }
  build_obj_list(last,list,tester,mode);
  num_head = L'\0';
  show_obj_list(mode);
  return;
}

Assistant:

void show_quiver(int mode, item_tester tester)
{
	int i, last_slot = -1;

	/* Initialize */
	wipe_obj_list();

	/* Find the last occupied quiver slot */
	for (i = 0; i < z_info->quiver_size; i++)
		if (player->upkeep->quiver[i] != NULL) last_slot = i;

	/* Build the object list */
	build_obj_list(last_slot, player->upkeep->quiver, tester, mode);

	/* Display the object list */
	num_head = 0;
	show_obj_list(mode);
}